

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraKateGenerator::CreateKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  string *psVar1;
  ostream *poVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string filename;
  cmGeneratedFileStream fout;
  string local_2c0;
  string local_2a0;
  undefined1 local_280 [16];
  undefined8 local_270;
  char *local_268;
  byte abStack_260 [584];
  
  psVar1 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  local_280._8_8_ = (psVar1->_M_dataplus)._M_p;
  local_280._0_8_ = psVar1->_M_string_length;
  local_270 = 0xd;
  local_268 = "/.kateproject";
  views._M_len = 2;
  views._M_array = (iterator)local_280;
  cmCatViews_abi_cxx11_(&local_2a0,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_280,&local_2a0,false,None);
  if ((abStack_260[(long)*(_func_int **)(local_280._0_8_ + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n\t\"name\": \"",0xc)
    ;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_280,(this->ProjectName)._M_dataplus._M_p,
                        (this->ProjectName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\",\n\t\"directory\": \"",0x12);
    psVar1 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\",\n\t\"files\": [ { ",0x11);
    GenerateFilesString_abi_cxx11_(&local_2c0,this,lg);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} ],\n",5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    WriteTargets(this,lg,(cmGeneratedFileStream *)local_280);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraKateGenerator::CreateKateProjectFile(
  const cmLocalGenerator& lg) const
{
  std::string filename = cmStrCat(lg.GetBinaryDirectory(), "/.kateproject");
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  /* clang-format off */
  fout <<
    "{\n"
    "\t\"name\": \"" << this->ProjectName << "\",\n"
    "\t\"directory\": \"" << lg.GetSourceDirectory() << "\",\n"
    "\t\"files\": [ { " << this->GenerateFilesString(lg) << "} ],\n";
  /* clang-format on */
  this->WriteTargets(lg, fout);
  fout << "}\n";
}